

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpHeaderBase.cpp
# Opt level: O0

ErrCode __thiscall HttpHeaderBase::getFieldInt64(HttpHeaderBase *this,FieldType type,int64_t *value)

{
  char *__nptr;
  longlong lVar1;
  char *str;
  int64_t *value_local;
  FieldType type_local;
  HttpHeaderBase *this_local;
  
  __nptr = getField(this,type);
  if (__nptr == (char *)0x0) {
    *value = 0;
  }
  else {
    lVar1 = strtoll(__nptr,(char **)0x0,0);
    *value = lVar1;
  }
  this_local._4_4_ = (ErrCode)(__nptr == (char *)0x0);
  return this_local._4_4_;
}

Assistant:

ErrCode HttpHeaderBase::getFieldInt64(FieldMap::FieldType type,
									  int64_t &value) const
{
	const char *str = getField(type);
	
	if (str != NULL)
	{
		value = strtoll(str, NULL, 0);
		return kNoError;
	}
	
	value = 0;
	return kNotFound;
}